

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_select(roaring_bitmap_t *bm,uint32_t rank,uint32_t *element)

{
  int iVar1;
  uint8_t uVar2;
  _Bool _Var3;
  uint in_EAX;
  long lVar4;
  uint uVar5;
  bool bVar6;
  run_container_t *container;
  long lVar7;
  uint32_t start_rank;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar1 = (bm->high_low_container).size;
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      container = (run_container_t *)(bm->high_low_container).containers[lVar7];
      uVar2 = (bm->high_low_container).typecodes[lVar7];
      if (uVar2 == '\x04') {
        uVar2 = *(uint8_t *)&container->runs;
        container = *(run_container_t **)container;
      }
      if (uVar2 == '\x03') {
        _Var3 = run_container_select(container,(uint32_t *)((long)&uStack_38 + 4),rank,element);
LAB_0010ee7d:
        if (_Var3 != false) {
code_r0x0010eea0:
          *element = *element |
                     (uint)(bm->high_low_container).keys[(lVar7 + 1U & 0xffffffff) - 1] << 0x10;
          return bVar6;
        }
      }
      else {
        if (uVar2 != '\x02') {
          _Var3 = bitset_container_select
                            ((bitset_container_t *)container,(uint32_t *)((long)&uStack_38 + 4),rank
                             ,element);
          goto LAB_0010ee7d;
        }
        uVar5 = container->n_runs + uStack_38._4_4_;
        if (rank < uVar5) {
          *element = (uint)(&container->runs->value)[rank - uStack_38._4_4_];
          goto code_r0x0010eea0;
        }
        uStack_38 = CONCAT44(uVar5,(undefined4)uStack_38);
      }
      lVar7 = lVar7 + 1;
      lVar4 = (long)(bm->high_low_container).size;
      bVar6 = lVar7 < lVar4;
    } while (lVar7 < lVar4);
  }
  return bVar6;
}

Assistant:

bool roaring_bitmap_select(const roaring_bitmap_t *bm, uint32_t rank,
                           uint32_t *element) {
    container_t *container;
    uint8_t typecode;
    uint16_t key;
    uint32_t start_rank = 0;
    int i = 0;
    bool valid = false;
    while (!valid && i < bm->high_low_container.size) {
        container = bm->high_low_container.containers[i];
        typecode = bm->high_low_container.typecodes[i];
        valid =
            container_select(container, typecode, &start_rank, rank, element);
        i++;
    }

    if (valid) {
        key = bm->high_low_container.keys[i - 1];
        *element |= (((uint32_t)key) << 16);  // w/o cast, key promotes signed
        return true;
    } else
        return false;
}